

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O2

void __thiscall
cmDebugServerConsole::ProcessRequest
          (cmDebugServerConsole *this,cmConnection *connection,string *request)

{
  cmDebugger *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  istream *piVar6;
  ostream *poVar7;
  cmMakefile *this_00;
  char *pcVar8;
  WatchpointType type;
  ulong uVar9;
  char cVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  cmListFileContext *pcVar11;
  uint uVar12;
  long i;
  vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> bps;
  string local_4d0 [40];
  string fileLines;
  undefined1 local_488 [32];
  cmPauseContext ctx;
  vector<cmWatchpoint,_std::allocator<cmWatchpoint>_> wps;
  long local_410;
  cmListFileContext currentLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bpSpecifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [15];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  bVar2 = std::operator==(request,"b");
  cVar10 = (char)request;
  if (bVar2) {
    (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x15])();
    goto LAB_004c4aba;
  }
  bVar2 = std::operator==(request,"q");
  if (bVar2) {
    exit(0);
  }
  lVar5 = std::__cxx11::string::find((char *)request,0x5ec96e);
  if (lVar5 == 0) {
    std::__cxx11::string::substr((ulong)&bpSpecifier,(ulong)request);
    pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
    (*pcVar1->_vptr_cmDebugger[0x12])(pcVar1,&bpSpecifier,0xb);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bps,
                   "Set watchpoint on write \'",&bpSpecifier);
    std::operator+(&currentLine.Name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bps,"\'\n")
    ;
    (**connection->_vptr_cmConnection)(connection,&currentLine);
LAB_004c4a96:
    std::__cxx11::string::~string((string *)&currentLine);
    std::__cxx11::string::~string((string *)&bps);
LAB_004c4aad:
    this_01 = &bpSpecifier;
LAB_004c4ab5:
    std::__cxx11::string::~string((string *)this_01);
  }
  else {
    lVar5 = std::__cxx11::string::find((char *)request,0x5ec94c);
    if (lVar5 == 0) {
      std::__cxx11::string::substr((ulong)&bpSpecifier,(ulong)request);
      pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
      (*pcVar1->_vptr_cmDebugger[0x12])(pcVar1,&bpSpecifier,4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bps,
                     "Set watchpoint on read \'",&bpSpecifier);
      std::operator+(&currentLine.Name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bps,
                     "\'\n");
      (**connection->_vptr_cmConnection)(connection,&currentLine);
      goto LAB_004c4a96;
    }
    lVar5 = std::__cxx11::string::find((char *)request,0x5ec96d);
    if (lVar5 == 0) {
      std::__cxx11::string::substr((ulong)&bpSpecifier,(ulong)request);
      pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
      (*pcVar1->_vptr_cmDebugger[0x12])(pcVar1,&bpSpecifier,0xf);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bps,
                     "Set watchpoint on read/write \'",&bpSpecifier);
      std::operator+(&currentLine.Name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bps,
                     "\'\n");
      (**connection->_vptr_cmConnection)(connection,&currentLine);
      goto LAB_004c4a96;
    }
    lVar5 = std::__cxx11::string::find((char *)request,0x5ec994);
    if (lVar5 != 0) {
      lVar5 = std::__cxx11::string::find((char *)request,0x5ec9be);
      if (lVar5 != 0) {
        lVar5 = std::__cxx11::string::find((char *)request,0x5ec999);
        if (lVar5 == 0) {
          lVar5 = std::__cxx11::string::find(cVar10,0x20);
          if (lVar5 != -1) {
            std::__cxx11::string::substr((ulong)&bpSpecifier,(ulong)request);
            lVar5 = std::__cxx11::string::rfind((char)&bpSpecifier,0x3a);
            if (lVar5 != -1) {
              std::__cxx11::string::substr((ulong)&currentLine,(ulong)&bpSpecifier);
              iVar4 = std::__cxx11::stoi(&currentLine.Name,(size_t *)0x0,10);
              std::__cxx11::string::~string((string *)&currentLine);
              std::__cxx11::string::substr((ulong)&currentLine,(ulong)&bpSpecifier);
              std::__cxx11::string::operator=((string *)&bpSpecifier,(string *)&currentLine);
              std::__cxx11::string::~string((string *)&currentLine);
              pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
              (*pcVar1->_vptr_cmDebugger[0xe])(pcVar1,&bpSpecifier,(long)iVar4);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_488,"Break at ",&bpSpecifier);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &wps,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_488,":");
              std::__cxx11::to_string(&fileLines,(long)iVar4);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &bps,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&wps,&fileLines);
              std::operator+(&currentLine.Name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &bps,"\n");
              (**connection->_vptr_cmConnection)(connection,&currentLine);
              std::__cxx11::string::~string((string *)&currentLine);
              std::__cxx11::string::~string((string *)&bps);
              std::__cxx11::string::~string((string *)&fileLines);
              std::__cxx11::string::~string((string *)&wps);
              std::__cxx11::string::~string((string *)local_488);
            }
            std::__cxx11::string::~string((string *)&bpSpecifier);
          }
        }
        goto LAB_004c4aba;
      }
      lVar5 = std::__cxx11::string::find(cVar10,0x20);
      if (lVar5 == -1) {
        (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x11])()
        ;
        (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x14])()
        ;
        std::__cxx11::string::string
                  ((string *)&bpSpecifier,"Cleared all breakpoints and watchpoints\n",
                   (allocator *)&currentLine);
        (**connection->_vptr_cmConnection)(connection,&bpSpecifier);
        goto LAB_004c4aad;
      }
      std::__cxx11::string::substr((ulong)&bpSpecifier,(ulong)request);
      iVar4 = std::__cxx11::stoi(&bpSpecifier,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&bpSpecifier);
      pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
      iVar3 = (*pcVar1->_vptr_cmDebugger[0xf])(pcVar1,(long)iVar4);
      if ((char)iVar3 == '\0') {
        pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
        iVar3 = (*pcVar1->_vptr_cmDebugger[0x13])(pcVar1,(long)iVar4);
        if ((char)iVar3 == '\0') {
          std::__cxx11::to_string((string *)&bps,iVar4);
          std::operator+(&currentLine.Name,"Could not find breakpoint or watchpoint with ID of ",
                         (string *)&bps);
          std::operator+(&bpSpecifier,&currentLine.Name,"\n");
          (**connection->_vptr_cmConnection)(connection,&bpSpecifier);
        }
        else {
          std::__cxx11::to_string((string *)&bps,iVar4);
          std::operator+(&currentLine.Name,"Cleared watchpoint ",(string *)&bps);
          std::operator+(&bpSpecifier,&currentLine.Name,"\n");
          (**connection->_vptr_cmConnection)(connection,&bpSpecifier);
        }
      }
      else {
        std::__cxx11::to_string((string *)&bps,iVar4);
        std::operator+(&currentLine.Name,"Cleared breakpoint ",(string *)&bps);
        std::operator+(&bpSpecifier,&currentLine.Name,"\n");
        (**connection->_vptr_cmConnection)(connection,&bpSpecifier);
      }
      std::__cxx11::string::~string((string *)&bpSpecifier);
      std::__cxx11::string::~string((string *)&currentLine);
      this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bps;
      goto LAB_004c4ab5;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&bpSpecifier);
    (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[7])(&bps);
    uVar12 = 0;
    while( true ) {
      if ((ulong)(((long)bps.super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)bps.super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x30) <= (ulong)uVar12) break;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&bpSpecifier.field_2);
      poVar7 = std::operator<<(poVar7," \tbreakpoint \t");
      poVar7 = std::operator<<(poVar7,(string *)
                                      &bps.
                                       super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar12].File);
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::endl<char,std::char_traits<char>>(poVar7);
      uVar12 = uVar12 + 1;
    }
    pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
    (*pcVar1->_vptr_cmDebugger[8])
              (&wps,pcVar1,
               ((long)bps.super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)bps.super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>._M_impl.
                     super__Vector_impl_data._M_start) % 0x30);
    for (uVar12 = 0; uVar9 = (ulong)uVar12,
        uVar9 < (ulong)(((long)wps.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)wps.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x30); uVar12 = uVar12 + 1
        ) {
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&bpSpecifier.field_2);
      poVar7 = std::operator<<(poVar7," \twatchpoint \t");
      poVar7 = std::operator<<(poVar7,(string *)
                                      &wps.
                                       super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar9].Variable);
      poVar7 = std::operator<<(poVar7," \t(");
      cmWatchpoint::GetTypeAsString_abi_cxx11_
                (&currentLine.Name,
                 (cmWatchpoint *)
                 (ulong)wps.super__Vector_base<cmWatchpoint,_std::allocator<cmWatchpoint>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar9].Type,type);
      poVar7 = std::operator<<(poVar7,(string *)&currentLine);
      poVar7 = std::operator<<(poVar7,")");
      std::endl<char,std::char_traits<char>>(poVar7);
      std::__cxx11::string::~string((string *)&currentLine);
    }
    std::__cxx11::stringbuf::str();
    (**connection->_vptr_cmConnection)(connection,&currentLine);
    std::__cxx11::string::~string((string *)&currentLine);
    std::vector<cmWatchpoint,_std::allocator<cmWatchpoint>_>::~vector(&wps);
    std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::~vector(&bps);
    std::__cxx11::stringstream::~stringstream((stringstream *)&bpSpecifier);
  }
LAB_004c4aba:
  (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x17])(&ctx);
  bVar2 = cmPauseContext::operator_cast_to_bool(&ctx);
  if (!bVar2) goto LAB_004c5727;
  lVar5 = std::__cxx11::string::find((char *)request,0x5eca53);
  if (lVar5 == 0) {
    cmPauseContext::StepOut(&ctx);
  }
  else {
    bVar2 = std::operator==(request,"c");
    if (bVar2) {
      cmPauseContext::Continue(&ctx);
    }
    else {
      bVar2 = std::operator==(request,"n");
      if (bVar2) {
        cmPauseContext::Step(&ctx);
      }
      else {
        bVar2 = std::operator==(request,"s");
        if (bVar2) {
          cmPauseContext::StepIn(&ctx);
        }
        else {
          lVar5 = std::__cxx11::string::find((char *)request,0x5ddbea);
          if (lVar5 == 0) {
            cmPauseContext::CurrentLine((cmListFileContext *)&bps,&ctx);
            cmPauseContext::CurrentLine((cmListFileContext *)&wps,&ctx);
            std::ifstream::ifstream(&bpSpecifier,local_4d0,_S_in);
            std::istream::seekg(&bpSpecifier,0,0);
            lVar5 = 1;
            if (1 < local_410) {
              lVar5 = local_410;
            }
            while (lVar5 = lVar5 + -1, lVar5 != 0) {
              std::istream::ignore((long)&bpSpecifier,-1);
            }
            std::__cxx11::stringstream::stringstream((stringstream *)&currentLine);
            local_488._0_8_ = local_488 + 0x10;
            local_488._8_8_ = 0;
            local_488[0x10] = '\0';
            lVar5 = local_410 + 10;
            for (; local_410 < lVar5; local_410 = local_410 + 1) {
              piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)&bpSpecifier,(string *)local_488);
              if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
                poVar7 = std::ostream::_M_insert<long>((long)&currentLine.Name.field_2);
                poVar7 = std::operator<<(poVar7,"\t|");
                poVar7 = std::operator<<(poVar7,(string *)local_488);
                std::endl<char,std::char_traits<char>>(poVar7);
              }
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::~string((string *)local_488);
            std::__cxx11::stringstream::~stringstream((stringstream *)&currentLine);
            std::ifstream::~ifstream(&bpSpecifier);
            cmListFileContext::~cmListFileContext((cmListFileContext *)&wps);
            cmListFileContext::~cmListFileContext((cmListFileContext *)&bps);
            std::operator+(&bpSpecifier,&fileLines,"\n");
            (**connection->_vptr_cmConnection)(connection,&bpSpecifier);
            std::__cxx11::string::~string((string *)&bpSpecifier);
            pcVar11 = (cmListFileContext *)&fileLines;
          }
          else {
            lVar5 = std::__cxx11::string::find((char *)request,0x5f41db);
            if (lVar5 != 0) {
              bVar2 = std::operator==(request,"bt");
              if (bVar2) {
                cmPauseContext::CurrentLine(&currentLine,&ctx);
                std::operator+(&local_70,"Paused at ",&currentLine.FilePath);
                std::operator+(&fileLines,&local_70,":");
                std::__cxx11::to_string(&local_50,currentLine.Line);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_488,&fileLines,&local_50);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &wps,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_488," (");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &bps,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&wps,&currentLine.Name);
                std::operator+(&bpSpecifier,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &bps,")\n");
                (**connection->_vptr_cmConnection)(connection,&bpSpecifier);
                std::__cxx11::string::~string((string *)&bpSpecifier);
                std::__cxx11::string::~string((string *)&bps);
                std::__cxx11::string::~string((string *)&wps);
                std::__cxx11::string::~string((string *)local_488);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&fileLines);
                std::__cxx11::string::~string((string *)&local_70);
                cmPauseContext::GetBacktrace((cmListFileBacktrace *)&bps,&ctx);
                std::__cxx11::stringstream::stringstream((stringstream *)&bpSpecifier);
                cmListFileBacktrace::PrintCallStack
                          ((cmListFileBacktrace *)&bps,(ostream *)&bpSpecifier.field_2);
                std::__cxx11::stringbuf::str();
                (**connection->_vptr_cmConnection)(connection,&wps);
                std::__cxx11::string::~string((string *)&wps);
                std::__cxx11::stringstream::~stringstream((stringstream *)&bpSpecifier);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&bps);
                cmListFileContext::~cmListFileContext(&currentLine);
              }
              else {
                lVar5 = std::__cxx11::string::find((char *)request,0x5eca62);
                if (lVar5 == 0) {
                  std::__cxx11::string::substr((ulong)&bpSpecifier,(ulong)request);
                  this_00 = cmPauseContext::GetMakefile(&ctx);
                  pcVar8 = cmMakefile::GetDefinition(this_00,&bpSpecifier);
                  if (pcVar8 == (char *)0x0) {
                    std::operator+(&currentLine.Name,&bpSpecifier," isn\'t set.\n");
                    (**connection->_vptr_cmConnection)(connection,&currentLine);
                    pcVar11 = &currentLine;
                  }
                  else {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_488,"$ ",&bpSpecifier);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&wps,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_488," = ");
                    std::__cxx11::string::string((string *)&fileLines,pcVar8,(allocator *)&local_70)
                    ;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&bps,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&wps,&fileLines);
                    std::operator+(&currentLine.Name,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&bps,"\n");
                    (**connection->_vptr_cmConnection)(connection,&currentLine);
                    std::__cxx11::string::~string((string *)&currentLine);
                    std::__cxx11::string::~string((string *)&bps);
                    std::__cxx11::string::~string((string *)&fileLines);
                    std::__cxx11::string::~string((string *)&wps);
                    pcVar11 = (cmListFileContext *)local_488;
                  }
                  std::__cxx11::string::~string((string *)pcVar11);
                  pcVar11 = (cmListFileContext *)&bpSpecifier;
                  goto LAB_004c5713;
                }
                lVar5 = std::__cxx11::string::find((char *)request,0x5ec999);
                if (lVar5 == 0) {
                  lVar5 = std::__cxx11::string::find(cVar10,0x20);
                  if (lVar5 != -1) {
                    std::__cxx11::string::substr((ulong)&currentLine,(ulong)request);
                    lVar5 = std::__cxx11::string::rfind('\0',0x3a);
                    if ((lVar5 == -1) && ((int)*currentLine.Name._M_dataplus._M_p - 0x30U < 10)) {
                      iVar4 = std::__cxx11::stoi(&currentLine.Name,(size_t *)0x0,10);
                      cmPauseContext::CurrentLine((cmListFileContext *)&bpSpecifier,&ctx);
                      std::__cxx11::string::operator=((string *)&currentLine,(string *)local_258);
                      cmListFileContext::~cmListFileContext((cmListFileContext *)&bpSpecifier);
                      pcVar1 = (this->super_cmDebugServer).super_cmDebuggerListener.Debugger;
                      (*pcVar1->_vptr_cmDebugger[0xe])(pcVar1,&currentLine,(long)iVar4);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_488,"Break at ",&currentLine.Name);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&wps,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_488,":");
                      std::__cxx11::to_string(&fileLines,(long)iVar4);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&bps,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&wps,&fileLines);
                      std::operator+(&bpSpecifier,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&bps,"\n");
                      (**connection->_vptr_cmConnection)(connection,&bpSpecifier);
                      std::__cxx11::string::~string((string *)&bpSpecifier);
                      std::__cxx11::string::~string((string *)&bps);
                      std::__cxx11::string::~string((string *)&fileLines);
                      std::__cxx11::string::~string((string *)&wps);
                      std::__cxx11::string::~string((string *)local_488);
                    }
                    goto LAB_004c554a;
                  }
                }
              }
              goto LAB_004c5718;
            }
            if (request->_M_string_length == 4) {
              std::__cxx11::string::string((string *)&currentLine,"",(allocator *)&bpSpecifier);
            }
            else {
              std::__cxx11::string::substr((ulong)&bpSpecifier,(ulong)request);
              std::operator+(&currentLine.Name,&bpSpecifier," ");
              std::__cxx11::string::~string((string *)&bpSpecifier);
            }
            cmPauseContext::CurrentLine((cmListFileContext *)&bpSpecifier,&ctx);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bps
                           ,&currentLine.Name,local_258);
            system((char *)bps.super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>.
                           _M_impl.super__Vector_impl_data._M_start);
            std::__cxx11::string::~string((string *)&bps);
            cmListFileContext::~cmListFileContext((cmListFileContext *)&bpSpecifier);
LAB_004c554a:
            pcVar11 = &currentLine;
          }
LAB_004c5713:
          std::__cxx11::string::~string((string *)pcVar11);
        }
      }
    }
  }
LAB_004c5718:
  printPrompt(this,connection);
LAB_004c5727:
  std::unique_lock<std::recursive_timed_mutex>::~unique_lock(&ctx.Lock);
  return;
}

Assistant:

void cmDebugServerConsole::ProcessRequest(cmConnection* connection,
                                          const std::string& request)
{
  if (request == "b") {
    Debugger.Break();
  } else if (request == "q") {
    exit(0);
  } else if (request.find("watch ") == 0) {
    auto whatToWatch = request.substr(strlen("watch "));
    Debugger.SetWatchpoint(whatToWatch);
    connection->WriteData("Set watchpoint on write '" + whatToWatch + "'\n");
  } else if (request.find("rwatch ") == 0) {
    auto whatToWatch = request.substr(strlen("rwatch "));
    Debugger.SetWatchpoint(whatToWatch, cmWatchpoint::WATCHPOINT_READ);
    connection->WriteData("Set watchpoint on read '" + whatToWatch + "'\n");
  } else if (request.find("awatch ") == 0) {
    auto whatToWatch = request.substr(strlen("awatch "));
    Debugger.SetWatchpoint(whatToWatch, cmWatchpoint::WATCHPOINT_ALL);
    connection->WriteData("Set watchpoint on read/write '" + whatToWatch +
                          "'\n");
  } else if (request.find("info br") == 0) {
    std::stringstream ss;
    auto bps = Debugger.GetBreakpoints();
    for (unsigned i = 0; i < bps.size(); i++) {
      ss << bps[i].Id << " \tbreakpoint \t" << bps[i].File << ":"
         << bps[i].Line << std::endl;
    }
    auto wps = Debugger.GetWatchpoints();
    for (unsigned i = 0; i < wps.size(); i++) {
      ss << wps[i].Id << " \twatchpoint \t" << wps[i].Variable << " \t("
         << cmWatchpoint::GetTypeAsString(wps[i].Type) << ")" << std::endl;
    }
    connection->WriteData(ss.str());
  } else if (request.find("clear") == 0) {
    auto space = request.find(' ');
    if (space == std::string::npos) {
      Debugger.ClearAllBreakpoints();
      Debugger.ClearAllWatchpoints();
      connection->WriteData("Cleared all breakpoints and watchpoints\n");
    } else {
      auto clearWhat = stoi(request.substr(space));

      if (Debugger.ClearBreakpoint(clearWhat)) {
        connection->WriteData("Cleared breakpoint " +
                              std::to_string(clearWhat) + "\n");
      } else if (Debugger.ClearWatchpoint(clearWhat)) {
        connection->WriteData("Cleared watchpoint " +
                              std::to_string(clearWhat) + "\n");
      } else {
        connection->WriteData(
          "Could not find breakpoint or watchpoint with ID of " +
          std::to_string(clearWhat) + "\n");
      }
    }
  } else if (request.find("br") == 0) {
    auto space = request.find(' ');

    // The state doesn't matter if we set an absolute path, so handle that
    // here.
    if (space != std::string::npos) {
      auto bpSpecifier = request.substr(space + 1);
      auto colonPlacement = bpSpecifier.find_last_of(':');
      size_t line = (size_t)-1;

      if (colonPlacement != std::string::npos) {
        line = std::stoi(bpSpecifier.substr(colonPlacement + 1));
        bpSpecifier = bpSpecifier.substr(0, colonPlacement);

        Debugger.SetBreakpoint(bpSpecifier, line);
        connection->WriteData("Break at " + bpSpecifier + ":" +
                              std::to_string(line) + "\n");
      }
    }
  }

  auto ctx = Debugger.PauseContext();
  if (!ctx) {
    return;
  }

  if (request.find("fin") == 0) {
    ctx.StepOut();
  } else if (request == "c") {
    ctx.Continue();
  } else if (request == "n") {
    ctx.Step();
  } else if (request == "s") {
    ctx.StepIn();
  } else if (request.find("l") == 0) {
    auto ctxLines = 10;
    auto fileLines = getFileLines(ctx.CurrentLine().FilePath,
                                  ctx.CurrentLine().Line, ctxLines);
    connection->WriteData(fileLines + "\n");
  } else if (request.find("open") == 0) {
    auto shellCmd =
      request.size() == 4 ? "" : (request.substr(strlen("open ")) + " ");
    system((shellCmd + ctx.CurrentLine().FilePath).c_str());
  } else if (request == "bt") {
    auto currentLine = ctx.CurrentLine();
    connection->WriteData("Paused at " + currentLine.FilePath + ":" +
                          std::to_string(currentLine.Line) + " (" +
                          currentLine.Name + ")\n");

    auto bt = ctx.GetBacktrace();
    std::stringstream ss;
    bt.PrintCallStack(ss);
    connection->WriteData(ss.str());
  } else if (request.find("print ") == 0) {
    auto whatToPrint = request.substr(strlen("print "));
    auto val = ctx.GetMakefile()->GetDefinition(whatToPrint);
    if (val) {
      connection->WriteData("$ " + whatToPrint + " = " + std::string(val) +
                            "\n");
    } else {
      connection->WriteData(whatToPrint + " isn't set.\n");
    }
  } else if (request.find("br") == 0) {
    auto space = request.find(' ');
    if (space != std::string::npos) {
      auto bpSpecifier = request.substr(space + 1);
      auto colonPlacement = bpSpecifier.find_last_of(':');
      size_t line = (size_t)-1;

      if (colonPlacement == std::string::npos &&
          isdigit(*bpSpecifier.c_str())) {
        line = std::stoi(bpSpecifier);
        bpSpecifier = ctx.CurrentLine().FilePath;
        Debugger.SetBreakpoint(bpSpecifier, line);
        connection->WriteData("Break at " + bpSpecifier + ":" +
                              std::to_string(line) + "\n");
      }
    }
  }

  printPrompt(connection);
}